

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O2

Vec_Int_t * Dau_DecFindSets_int(word *pInit,int nVars,int **pSched)

{
  word *pwVar1;
  word *pwVar2;
  ulong *puVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  Vec_Int_t *p_00;
  int *piVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  int sizeB;
  ulong uVar14;
  word *pwVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  int i;
  int i_00;
  ulong uVar19;
  word *pwVar20;
  uint local_212c;
  int pVarsB [16];
  int P2V [16];
  int V2P [16];
  word p [1024];
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 0x20;
  p_00->nSize = 0;
  piVar9 = (int *)malloc(0x80);
  iVar17 = 1 << ((byte)nVars & 0x1f);
  uVar16 = 1 << ((byte)nVars - 6 & 0x1f);
  p_00->pArray = piVar9;
  uVar12 = uVar16;
  if (nVars < 7) {
    uVar12 = 1;
  }
  memcpy(p,pInit,(long)(int)uVar12 << 3);
  uVar10 = 0;
  uVar11 = (ulong)uVar16;
  if ((int)uVar16 < 1) {
    uVar11 = uVar10;
  }
  uVar18 = 0;
  if (0 < nVars) {
    uVar18 = (ulong)(uint)nVars;
  }
  do {
    if (uVar10 == uVar18) {
      for (uVar11 = 0; uVar18 != uVar11; uVar11 = uVar11 + 1) {
        P2V[uVar11] = (int)uVar11;
        V2P[uVar11] = (int)uVar11;
      }
      if (iVar17 < 1) {
        iVar17 = 0;
      }
      iVar13 = nVars + -2;
      uVar11 = 2;
      local_212c = 1;
      do {
        if ((long)nVars <= (long)uVar11) {
          return p_00;
        }
        sizeB = (int)uVar11;
        bVar4 = (byte)uVar11 & 0x1f;
        iVar5 = 1 << bVar4;
        i = 0;
        if (1 << bVar4 < 1) {
          iVar5 = 0;
        }
        for (; i != iVar17; i = i + 1) {
          uVar12 = Abc_TtBitCount16(i);
          if (uVar11 == uVar12) {
            Dau_DecMoveFreeToLSB(p,nVars,V2P,P2V,i,sizeB);
            for (uVar10 = 0; uVar11 != uVar10; uVar10 = uVar10 + 1) {
              pVarsB[uVar10] = P2V[(long)iVar13 + uVar10];
            }
            iVar6 = Dau_DecCheckSetTop(p,nVars,nVars - sizeB,sizeB,0,0,pSched[uVar11],(word *)0x0,
                                       (word *)0x0);
            if (iVar6 == 0) {
              if (uVar11 != 2) {
                for (uVar12 = 1; uVar12 != local_212c; uVar12 = uVar12 + 1) {
                  if (uVar12 < 4) {
                    for (iVar6 = 0; iVar6 != iVar5; iVar6 = iVar6 + 1) {
                      uVar16 = Abc_TtBitCount16(iVar6);
                      if (uVar16 == uVar12) {
                        uVar16 = Dau_DecCreateSet(pVarsB,sizeB,iVar6);
                        i_00 = 0;
                        iVar8 = p_00->nSize;
                        if (p_00->nSize < 1) {
                          iVar8 = i_00;
                        }
                        for (; iVar8 != i_00; i_00 = i_00 + 1) {
                          uVar7 = Vec_IntEntry(p_00,i_00);
                          if (((uVar7 & ~uVar16) == 0) &&
                             ((~(~uVar7 & uVar16) >> 1 & ~uVar7 & uVar16 & 0x55555555) == 0))
                          goto LAB_0043c5e6;
                        }
                        iVar8 = Dau_DecCheckSetTop(p,nVars,nVars - sizeB,sizeB,uVar12,iVar6,
                                                   pSched[uVar11],(word *)0x0,(word *)0x0);
                        if (iVar8 != 0) {
                          Vec_IntPush(p_00,uVar16);
                        }
                      }
LAB_0043c5e6:
                    }
                  }
                }
              }
            }
            else {
              uVar12 = Dau_DecCreateSet(pVarsB,sizeB,0);
              Vec_IntPush(p_00,uVar12);
            }
          }
        }
        uVar11 = uVar11 + 1;
        local_212c = local_212c + 1;
        iVar13 = iVar13 + -1;
      } while( true );
    }
    bVar4 = (byte)uVar10;
    if (nVars < 7) {
      if ((s_Truths6Neg[uVar10] & (p[0] >> ((byte)(1 << (bVar4 & 0x1f)) & 0x3f) ^ p[0])) == 0) {
LAB_0043c62a:
        __assert_fail("Abc_TtHasVar( p, nVars, v )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNonDsd.c"
                      ,0x1d8,"Vec_Int_t *Dau_DecFindSets_int(word *, int, int **)");
      }
    }
    else {
      if (5 < uVar10) {
        uVar12 = 1 << (bVar4 - 6 & 0x1f);
        iVar13 = 2 << (bVar4 - 6 & 0x1f);
        uVar14 = 0;
        if (0 < (int)uVar12) {
          uVar14 = (ulong)uVar12;
        }
        pwVar15 = p + (int)uVar12;
        for (pwVar20 = p; pwVar20 < p + (int)uVar16; pwVar20 = pwVar20 + iVar13) {
          uVar19 = 0;
          while (uVar14 != uVar19) {
            pwVar1 = pwVar20 + uVar19;
            pwVar2 = pwVar15 + uVar19;
            uVar19 = uVar19 + 1;
            if (*pwVar1 != *pwVar2) goto LAB_0043c370;
          }
          pwVar15 = pwVar15 + iVar13;
        }
        goto LAB_0043c62a;
      }
      uVar14 = 0;
      do {
        if (uVar11 == uVar14) goto LAB_0043c62a;
        puVar3 = p + uVar14;
        uVar14 = uVar14 + 1;
      } while ((s_Truths6Neg[uVar10] & (*puVar3 >> ((byte)(1 << (bVar4 & 0x1f)) & 0x3f) ^ *puVar3))
               == 0);
    }
LAB_0043c370:
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Dau_DecFindSets_int( word * pInit, int nVars, int * pSched[16] )
{
    Vec_Int_t * vSets = Vec_IntAlloc( 32 );
    int V2P[16], P2V[16], pVarsB[16];
    int Limit = (1 << nVars);
    int c, v, sizeB, sizeS, maskB, maskS;
    unsigned setMixed;
    word p[1<<10]; 
    memcpy( p, pInit, sizeof(word) * Abc_TtWordNum(nVars) );
    for ( v = 0; v < nVars; v++ )
        assert( Abc_TtHasVar( p, nVars, v ) );
    // initialize permutation
    for ( v = 0; v < nVars; v++ )
        V2P[v] = P2V[v] = v;
    // iterate through bound sets of each size in increasing order
    for ( sizeB = 2; sizeB < nVars; sizeB++ ) // bound set size
    for ( maskB = 0; maskB < Limit; maskB++ ) // bound set
    if ( Abc_TtBitCount16(maskB) == sizeB )
    {
        // permute variables to have bound set on top
        Dau_DecMoveFreeToLSB( p, nVars, V2P, P2V, maskB, sizeB );
        // collect bound set vars on levels nVars-sizeB to nVars-1
        for ( c = 0; c < sizeB; c++ )
            pVarsB[c] = P2V[nVars-sizeB+c];
        // check disjoint
//        if ( Dau_DecCheckSetTopOld(p, nVars, nVars-sizeB, sizeB, 0, 0, NULL, NULL, NULL) )
        if ( Dau_DecCheckSetTop(p, nVars, nVars-sizeB, sizeB, 0, 0, pSched[sizeB], NULL, NULL) )
        {
            Vec_IntPush( vSets, Dau_DecCreateSet(pVarsB, sizeB, 0) );
            continue;
        }
        if ( sizeB == 2 )
            continue;
        // iterate through shared sets of each size in the increasing order
        for ( sizeS = 1; sizeS <= sizeB - 2; sizeS++ )   // shared set size
        if ( sizeS <= 3 )
//        sizeS = 1; 
        for ( maskS = 0; maskS < (1 << sizeB); maskS++ ) // shared set
        if ( Abc_TtBitCount16(maskS) == sizeS )
        {
            setMixed = Dau_DecCreateSet( pVarsB, sizeB, maskS );
//            printf( "Considering %10d ", setMixed );
//            Dau_DecPrintSet( setMixed, nVars );
            // check if it exists
            if ( Dau_DecSetIsContained(vSets, setMixed) )
                continue;
            // check if it can be added
//            if ( Dau_DecCheckSetTopOld(p, nVars, nVars-sizeB, sizeB, sizeS, maskS, NULL, NULL, NULL) )
            if ( Dau_DecCheckSetTop(p, nVars, nVars-sizeB, sizeB, sizeS, maskS, pSched[sizeB], NULL, NULL) )
                Vec_IntPush( vSets, setMixed );
        }
    }
    return vSets;
}